

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayoutInfo::itemRect(QDockAreaLayoutInfo *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  qsizetype qVar3;
  const_reference len;
  QDockAreaLayoutInfo *in_RSI;
  long in_FS_OFFSET;
  QRect QVar4;
  QDockAreaLayoutItem *item;
  int index;
  qsizetype in_stack_ffffffffffffff88;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined1 in_stack_ffffffffffffffd0 [16];
  undefined1 auVar6 [13];
  
  auVar6 = in_stack_ffffffffffffffd0._3_13_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = QList<int>::first((QList<int> *)in_stack_ffffffffffffff90);
  iVar5 = *piVar2;
  qVar3 = QList<int>::size((QList<int> *)in_RSI);
  if (qVar3 < 2) {
    QVar4 = itemRect(auVar6._5_8_,auVar6._1_4_,auVar6[0]);
  }
  else {
    len = QList<QDockAreaLayoutItem>::at(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QList<int>::mid((QList<int> *)in_RSI,CONCAT44(iVar5,in_stack_ffffffffffffffb8),(qsizetype)len);
    QVar4 = itemRect(in_RSI,(QList<int> *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
    QList<int>::~QList((QList<int> *)0x5720ad);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayoutInfo::itemRect(const QList<int> &path) const
{
    Q_ASSERT(!path.isEmpty());

    const int index = path.first();
    if (path.size() > 1) {
        const QDockAreaLayoutItem &item = item_list.at(index);
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->itemRect(path.mid(1));
    }

    return itemRect(index);
}